

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS
ref_metric_belme_gu(REF_DBL *metric,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,REF_DBL mach,
                   REF_DBL re,REF_DBL reference_temp,REF_RECON_RECONSTRUCTION reconstruction)

{
  size_t __size;
  size_t __size_00;
  size_t __size_01;
  double dVar1;
  REF_NODE pRVar2;
  REF_GLOB *pRVar3;
  uint uVar4;
  int iVar5;
  REF_DBL *pRVar6;
  double *pdVar7;
  REF_DBL *pRVar8;
  REF_DBL *pRVar9;
  double dVar10;
  ulong uVar11;
  long *plVar12;
  undefined8 uVar13;
  uint uVar14;
  ulong uVar15;
  double *pdVar16;
  char *pcVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar27;
  undefined1 auVar26 [16];
  REF_DBL mu;
  REF_DBL mu_t;
  REF_DBL diag_system [12];
  double local_170;
  uint local_168;
  REF_RECON_RECONSTRUCTION local_164;
  REF_DBL *local_160;
  REF_DBL *local_158;
  REF_DBL *local_150;
  double local_148;
  REF_GRID local_140;
  double local_138;
  double local_130;
  double local_128;
  REF_DBL *local_120;
  double *local_118;
  REF_DBL local_110;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  void *local_f0;
  REF_DBL *local_e8;
  long local_e0;
  long local_d8;
  REF_DBL *local_d0;
  REF_DBL local_c8;
  REF_DBL local_c0;
  REF_DBL *local_b8;
  undefined8 uStack_b0;
  REF_DBL *local_a8;
  REF_DBL *local_a0;
  undefined1 local_98 [16];
  double local_88;
  
  pRVar2 = ref_grid->node;
  uVar4 = pRVar2->max;
  uVar11 = (ulong)uVar4;
  if ((int)uVar4 < 0) {
    pcVar17 = "malloc lam of REF_DBL negative";
    uVar13 = 0xacc;
LAB_001c84d3:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar13
           ,"ref_metric_belme_gu",pcVar17);
    return 1;
  }
  __size = uVar11 * 8;
  local_164 = reconstruction;
  local_140 = ref_grid;
  local_110 = mach;
  local_c8 = re;
  local_c0 = reference_temp;
  pRVar6 = (REF_DBL *)malloc(__size);
  if (pRVar6 == (REF_DBL *)0x0) {
    pcVar17 = "malloc lam of REF_DBL NULL";
    uVar13 = 0xacc;
    goto LAB_001c88d9;
  }
  local_168 = ldim;
  local_e8 = metric;
  if (uVar4 != 0) {
    memset(pRVar6,0,__size);
  }
  __size_00 = uVar11 * 0x30;
  local_d0 = (REF_DBL *)malloc(__size_00);
  if (local_d0 == (REF_DBL *)0x0) {
    pcVar17 = "malloc hess_lam of REF_DBL NULL";
    uVar13 = 0xacd;
    goto LAB_001c88d9;
  }
  local_160 = prim_dual;
  local_a0 = pRVar6;
  if (uVar4 != 0) {
    memset(local_d0,0,(uVar11 * 6 & 0xffffffff) << 3);
  }
  local_108 = (double)(uVar11 * 3);
  __size_01 = uVar11 * 0x18;
  pRVar6 = (REF_DBL *)malloc(__size_01);
  if (pRVar6 == (REF_DBL *)0x0) {
    pcVar17 = "malloc grad_lam of REF_DBL NULL";
    uVar13 = 0xace;
    goto LAB_001c88d9;
  }
  if (uVar4 != 0) {
    memset(pRVar6,0,((ulong)local_108 & 0xffffffff) << 3);
  }
  local_a8 = pRVar6;
  pdVar7 = (double *)malloc(uVar11 * 0x28);
  if (pdVar7 == (double *)0x0) {
    pcVar17 = "malloc sr_lam of REF_DBL NULL";
    uVar13 = 0xacf;
    goto LAB_001c88d9;
  }
  local_118 = pdVar7;
  if (uVar4 == 0) {
    pRVar6 = (REF_DBL *)malloc(__size);
    if (pRVar6 == (REF_DBL *)0x0) goto LAB_001c881c;
    pRVar8 = (REF_DBL *)malloc(__size_00);
    if (pRVar8 == (REF_DBL *)0x0) goto LAB_001c8842;
    pRVar9 = (REF_DBL *)malloc(__size_01);
    uVar14 = local_168;
    if (pRVar9 != (REF_DBL *)0x0) goto LAB_001c85e2;
  }
  else {
    memset(pdVar7,0,(uVar11 * 5 & 0xffffffff) << 3);
    pRVar6 = (REF_DBL *)calloc(1,__size);
    if (pRVar6 == (REF_DBL *)0x0) {
LAB_001c881c:
      pcVar17 = "malloc u of REF_DBL NULL";
      uVar13 = 0xad0;
      goto LAB_001c88d9;
    }
    pRVar8 = (REF_DBL *)malloc(__size_00);
    if (pRVar8 == (REF_DBL *)0x0) {
LAB_001c8842:
      pcVar17 = "malloc hess_u of REF_DBL NULL";
      uVar13 = 0xad1;
      goto LAB_001c88d9;
    }
    memset(pRVar8,0,(uVar11 * 6 & 0xffffffff) << 3);
    pRVar9 = (REF_DBL *)malloc(__size_01);
    uVar14 = local_168;
    if (pRVar9 != (REF_DBL *)0x0) {
      local_158 = pRVar6;
      local_150 = pRVar8;
      local_120 = pRVar9;
      memset(pRVar9,0,((ulong)local_108 & 0xffffffff) << 3);
      pRVar6 = local_158;
      pRVar8 = local_150;
      pRVar9 = local_120;
LAB_001c85e2:
      local_120 = pRVar9;
      local_150 = pRVar8;
      local_158 = pRVar6;
      local_f0 = malloc(uVar11 * 0x48);
      if (local_f0 != (void *)0x0) {
        if (uVar4 != 0) {
          memset(local_f0,0,(uVar11 * 9 & 0xffffffff) << 3);
        }
        local_e0 = (long)(int)uVar14;
        local_148 = (double)(long)((int)uVar14 / 2);
        pRVar6 = local_160 + (long)local_148;
        local_d8 = local_e0 * 8;
        dVar10 = 0.0;
        pdVar7 = local_118;
        do {
          if (0 < (int)uVar11) {
            pRVar3 = pRVar2->global;
            uVar15 = 0;
            pRVar8 = pRVar6;
            do {
              if (-1 < pRVar3[uVar15]) {
                local_a0[uVar15] = *pRVar8;
              }
              uVar15 = uVar15 + 1;
              pRVar8 = (REF_DBL *)((long)pRVar8 + local_d8);
            } while (uVar11 != uVar15);
          }
          local_108 = dVar10;
          uVar4 = ref_recon_hessian(local_140,local_a0,local_d0,local_164);
          if (uVar4 != 0) {
            pcVar17 = "hess_lam";
            uVar13 = 0xad9;
            goto LAB_001c88ac;
          }
          uVar11 = (ulong)(uint)pRVar2->max;
          local_b8 = pRVar6;
          if (0 < pRVar2->max) {
            lVar20 = 0;
            pRVar6 = local_d0;
            pdVar16 = pdVar7;
            do {
              if (-1 < pRVar2->global[lVar20]) {
                uVar4 = ref_matrix_diag_m(pRVar6,(REF_DBL *)local_98);
                if (uVar4 != 0) {
                  pcVar17 = "decomp";
                  uVar13 = 0xadb;
                  goto LAB_001c88ac;
                }
                auVar22._8_8_ = local_98._8_8_ ^ DAT_0020e040._8_8_;
                auVar22._0_8_ = local_98._0_8_ ^ (ulong)DAT_0020e040;
                auVar22 = maxpd(local_98,auVar22);
                dVar10 = auVar22._0_8_;
                if (auVar22._0_8_ <= auVar22._8_8_) {
                  dVar10 = auVar22._8_8_;
                }
                dVar24 = (double)((ulong)local_88 ^ (ulong)DAT_0020e040);
                dVar23 = local_88;
                if (local_88 <= dVar24) {
                  dVar23 = dVar24;
                }
                if (dVar10 <= dVar23) {
                  dVar10 = dVar23;
                }
                *pdVar16 = dVar10;
                uVar11 = (ulong)(uint)pRVar2->max;
              }
              lVar20 = lVar20 + 1;
              pdVar16 = pdVar16 + 5;
              pRVar6 = pRVar6 + 6;
            } while (lVar20 < (int)uVar11);
          }
          lVar20 = local_d8;
          pRVar8 = local_160;
          dVar10 = (double)((long)local_108 + 1);
          pRVar6 = local_b8 + 1;
          pdVar7 = pdVar7 + 1;
        } while (dVar10 != 2.47032822920623e-323);
        if (0 < (int)uVar11) {
          pRVar3 = pRVar2->global;
          pRVar6 = local_160 + (long)local_148 + 4;
          uVar15 = 0;
          do {
            if (-1 < pRVar3[uVar15]) {
              local_a0[uVar15] = *pRVar6;
            }
            uVar15 = uVar15 + 1;
            pRVar6 = (REF_DBL *)((long)pRVar6 + local_d8);
          } while (uVar11 != uVar15);
        }
        uVar4 = ref_recon_gradient(local_140,local_a0,local_a8,local_164);
        if (uVar4 == 0) {
          uVar11 = (ulong)(uint)pRVar2->max;
          pdVar7 = (double *)((long)local_f0 + 8);
          lVar21 = 0;
          pRVar6 = pRVar8;
          do {
            pRVar6 = pRVar6 + 1;
            if (0 < (int)uVar11) {
              pRVar3 = pRVar2->global;
              uVar15 = 0;
              pRVar9 = pRVar6;
              do {
                if (-1 < pRVar3[uVar15]) {
                  local_158[uVar15] = *pRVar9;
                }
                uVar15 = uVar15 + 1;
                pRVar9 = (REF_DBL *)((long)pRVar9 + lVar20);
              } while ((uVar11 & 0xffffffff) != uVar15);
            }
            uVar4 = ref_recon_gradient(local_140,local_158,local_120,local_164);
            pRVar9 = local_150;
            if (uVar4 != 0) {
              pcVar17 = "grad_u";
              uVar13 = 0xaed;
              goto LAB_001c88ac;
            }
            lVar21 = lVar21 + 1;
            iVar5 = pRVar2->max;
            uVar11 = (ulong)iVar5;
            if ((long)uVar11 < 1) {
              if (lVar21 == 3) goto LAB_001c8aa7;
            }
            else {
              plVar12 = pRVar2->global;
              lVar18 = 0;
              pdVar16 = pdVar7;
              do {
                if (-1 < *plVar12) {
                  dVar10 = *(double *)((long)local_a8 + lVar18 + 0x10);
                  dVar23 = *(double *)((long)local_120 + lVar18 + 8);
                  dVar24 = *(double *)((long)local_120 + lVar18 + 0x10);
                  dVar25 = SUB168(*(undefined1 (*) [16])((long)local_a8 + lVar18),0);
                  dVar27 = SUB168(*(undefined1 (*) [16])((long)local_a8 + lVar18),8);
                  dVar1 = *(double *)((long)local_120 + lVar18);
                  pdVar16[-1] = dVar23 * dVar10 - dVar27 * dVar24;
                  *pdVar16 = dVar24 * dVar25 - dVar10 * dVar1;
                  pdVar16[1] = dVar1 * dVar27 - dVar25 * dVar23;
                }
                pdVar16 = pdVar16 + 9;
                plVar12 = plVar12 + 1;
                lVar18 = lVar18 + 0x18;
              } while (uVar11 * 0x18 != lVar18);
              if (lVar21 == 3) goto LAB_001c8a7e;
            }
            pdVar7 = pdVar7 + 3;
          } while( true );
        }
        pcVar17 = "grad_u";
        uVar13 = 0xae6;
LAB_001c88ac:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar13,"ref_metric_belme_gu",(ulong)uVar4,pcVar17);
        return uVar4;
      }
      pcVar17 = "malloc omega of REF_DBL NULL";
      uVar13 = 0xad3;
      goto LAB_001c88d9;
    }
  }
  pcVar17 = "malloc grad_u of REF_DBL NULL";
  uVar13 = 0xad2;
LAB_001c88d9:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar13,
         "ref_metric_belme_gu",pcVar17);
  return 2;
LAB_001c8a7e:
  if (0 < iVar5) {
    pRVar8 = pRVar8 + 1;
    pRVar3 = pRVar2->global;
    uVar15 = 0;
    do {
      if (-1 < pRVar3[uVar15]) {
        local_158[uVar15] = *pRVar8;
      }
      uVar15 = uVar15 + 1;
      pRVar8 = (REF_DBL *)((long)pRVar8 + lVar20);
    } while (uVar11 != uVar15);
  }
LAB_001c8aa7:
  uVar4 = ref_recon_hessian(local_140,local_158,local_150,local_164);
  pRVar6 = local_e8;
  if (uVar4 == 0) {
    uVar4 = pRVar2->max;
    if (0 < (int)uVar4) {
      uVar14 = local_168 & 0xfffffffe;
      local_f8 = local_110 / local_c8;
      uVar19 = 0;
      lVar20 = 0;
      do {
        if (-1 < pRVar2->global[lVar20]) {
          lVar21 = lVar20 * local_e0;
          dVar10 = local_160[lVar21 + 1];
          dVar23 = local_160[lVar21 + 2];
          if (dVar10 <= -dVar10) {
            dVar10 = -dVar10;
          }
          if (dVar23 <= -dVar23) {
            dVar23 = -dVar23;
          }
          dVar24 = local_160[lVar21 + 3];
          if (dVar24 <= -dVar24) {
            dVar24 = -dVar24;
          }
          local_130 = local_118[lVar20 * 5 + 1] * 20.0;
          local_128 = local_118[lVar20 * 5 + 2];
          local_148 = local_118[lVar20 * 5 + 3];
          local_b8 = (REF_DBL *)
                     ((dVar24 + dVar24 + dVar10 * 20.0 + dVar23 + dVar23) *
                     local_118[lVar20 * 5 + 4]);
          uStack_b0 = 0;
          local_108 = *(double *)((long)local_f0 + lVar20 * 0x48 + 0x38) -
                      *(double *)((long)local_f0 + lVar20 * 0x48 + 0x28);
          if (local_108 <= -local_108) {
            local_108 = -local_108;
          }
          local_108 = local_108 * 1.6666666666666667;
          uStack_100 = 0;
          uVar4 = viscosity_law((local_160[lVar21 + 4] * 1.4) / local_160[lVar21],local_c0,
                                &local_170);
          if (uVar4 != 0) {
            pcVar17 = "sutherlands";
            uVar13 = 0xb08;
            goto LAB_001c88ac;
          }
          if (uVar14 == 0xc) {
            uVar4 = ref_phys_mut_sa(local_160[lVar21 + 5],local_160[lVar21],
                                    local_170 / local_160[lVar21],&local_138);
            if (uVar4 != 0) {
              pcVar17 = "eddy viscosity";
              uVar13 = 0xb0c;
              goto LAB_001c88ac;
            }
            local_170 = local_138 + local_170;
          }
          pRVar9 = local_150;
          dVar10 = (local_108 +
                   (double)local_b8 +
                   local_148 + local_148 + local_128 + local_128 + local_130 + 0.0) *
                   local_170 * local_f8;
          if (dVar10 < 0.0) {
            pcVar17 = "negative weight u1";
            uVar13 = 0xb10;
            goto LAB_001c84d3;
          }
          uVar11 = (ulong)(uVar19 & 0x7fffffff);
          lVar21 = 0;
          do {
            pRVar6[uVar11 * 2 + lVar21] =
                 local_150[uVar11 * 2 + lVar21] * dVar10 + pRVar6[uVar11 * 2 + lVar21];
            lVar21 = lVar21 + 1;
          } while (lVar21 != 6);
          uVar4 = ref_matrix_healthy_m(pRVar6 + lVar20 * 6);
          if (uVar4 != 0) {
            pcVar17 = "u1";
            uVar13 = 0xb14;
            goto LAB_001c88ac;
          }
          uVar4 = pRVar2->max;
        }
        lVar20 = lVar20 + 1;
        uVar19 = uVar19 + 3;
      } while (lVar20 < (int)uVar4);
      if (0 < (int)uVar4) {
        pRVar6 = local_160 + 2;
        pRVar3 = pRVar2->global;
        uVar11 = 0;
        do {
          if (-1 < pRVar3[uVar11]) {
            local_158[uVar11] = *pRVar6;
          }
          uVar11 = uVar11 + 1;
          pRVar6 = (REF_DBL *)((long)pRVar6 + local_d8);
        } while (uVar4 != uVar11);
      }
    }
    uVar4 = ref_recon_hessian(local_140,local_158,pRVar9,local_164);
    if (uVar4 == 0) {
      uVar4 = pRVar2->max;
      if (0 < (int)uVar4) {
        uVar14 = local_168 & 0xfffffffe;
        local_f8 = local_110 / local_c8;
        uVar19 = 0;
        lVar20 = 0;
        do {
          if (-1 < pRVar2->global[lVar20]) {
            lVar21 = lVar20 * local_e0;
            dVar10 = local_160[lVar21 + 1];
            dVar23 = local_160[lVar21 + 2];
            if (dVar10 <= -dVar10) {
              dVar10 = -dVar10;
            }
            if (dVar23 <= -dVar23) {
              dVar23 = -dVar23;
            }
            dVar24 = local_160[lVar21 + 3];
            if (dVar24 <= -dVar24) {
              dVar24 = -dVar24;
            }
            local_130 = local_118[lVar20 * 5 + 1];
            local_148 = local_118[lVar20 * 5 + 3];
            local_128 = local_118[lVar20 * 5 + 2] * 20.0;
            local_b8 = (REF_DBL *)
                       ((dVar24 + dVar24 + dVar10 + dVar10 + dVar23 * 20.0) *
                       local_118[lVar20 * 5 + 4]);
            uStack_b0 = 0;
            local_108 = *(double *)((long)local_f0 + lVar20 * 0x48 + 0x10) -
                        *(double *)((long)local_f0 + lVar20 * 0x48 + 0x30);
            if (local_108 <= -local_108) {
              local_108 = -local_108;
            }
            local_108 = local_108 * 1.6666666666666667;
            uStack_100 = 0;
            uVar4 = viscosity_law((local_160[lVar21 + 4] * 1.4) / local_160[lVar21],local_c0,
                                  &local_170);
            if (uVar4 != 0) {
              pcVar17 = "sutherlands";
              uVar13 = 0xb2b;
              goto LAB_001c88ac;
            }
            if (uVar14 == 0xc) {
              uVar4 = ref_phys_mut_sa(local_160[lVar21 + 5],local_160[lVar21],
                                      local_170 / local_160[lVar21],&local_138);
              if (uVar4 != 0) {
                pcVar17 = "eddy viscosity";
                uVar13 = 0xb2f;
                goto LAB_001c88ac;
              }
              local_170 = local_138 + local_170;
            }
            dVar10 = (local_108 +
                     (double)local_b8 +
                     local_148 + local_148 + local_128 + local_130 + local_130 + 0.0) *
                     local_170 * local_f8;
            if (dVar10 < 0.0) {
              pcVar17 = "negative weight u2";
              uVar13 = 0xb33;
              goto LAB_001c84d3;
            }
            uVar11 = (ulong)(uVar19 & 0x7fffffff);
            lVar21 = 0;
            do {
              local_e8[uVar11 * 2 + lVar21] =
                   local_150[uVar11 * 2 + lVar21] * dVar10 + local_e8[uVar11 * 2 + lVar21];
              lVar21 = lVar21 + 1;
            } while (lVar21 != 6);
            uVar4 = ref_matrix_healthy_m(local_e8 + lVar20 * 6);
            if (uVar4 != 0) {
              pcVar17 = "u2";
              uVar13 = 0xb37;
              goto LAB_001c88ac;
            }
            uVar4 = pRVar2->max;
          }
          lVar20 = lVar20 + 1;
          uVar19 = uVar19 + 3;
        } while (lVar20 < (int)uVar4);
        if (0 < (int)uVar4) {
          pRVar6 = local_160 + 3;
          pRVar3 = pRVar2->global;
          uVar11 = 0;
          do {
            if (-1 < pRVar3[uVar11]) {
              local_158[uVar11] = *pRVar6;
            }
            uVar11 = uVar11 + 1;
            pRVar6 = (REF_DBL *)((long)pRVar6 + local_d8);
          } while (uVar4 != uVar11);
        }
      }
      uVar4 = ref_recon_hessian(local_140,local_158,local_150,local_164);
      if (uVar4 == 0) {
        uVar4 = pRVar2->max;
        if (0 < (int)uVar4) {
          uVar14 = local_168 & 0xfffffffe;
          local_f8 = local_110 / local_c8;
          uVar19 = 0;
          lVar20 = 0;
          do {
            if (-1 < pRVar2->global[lVar20]) {
              lVar21 = lVar20 * local_e0;
              dVar10 = local_160[lVar21 + 1];
              dVar23 = local_160[lVar21 + 2];
              if (dVar10 <= -dVar10) {
                dVar10 = -dVar10;
              }
              if (dVar23 <= -dVar23) {
                dVar23 = -dVar23;
              }
              dVar24 = local_160[lVar21 + 3];
              if (dVar24 <= -dVar24) {
                dVar24 = -dVar24;
              }
              local_130 = local_118[lVar20 * 5 + 1];
              local_128 = local_118[lVar20 * 5 + 2];
              local_148 = local_118[lVar20 * 5 + 3] * 20.0;
              local_b8 = (REF_DBL *)
                         ((dVar24 * 20.0 + dVar10 + dVar10 + dVar23 + dVar23) *
                         local_118[lVar20 * 5 + 4]);
              uStack_b0 = 0;
              local_108 = *(double *)((long)local_f0 + lVar20 * 0x48 + 0x18) -
                          *(double *)((long)local_f0 + lVar20 * 0x48 + 8);
              if (local_108 <= -local_108) {
                local_108 = -local_108;
              }
              local_108 = local_108 * 1.6666666666666667;
              uStack_100 = 0;
              uVar4 = viscosity_law((local_160[lVar21 + 4] * 1.4) / local_160[lVar21],local_c0,
                                    &local_170);
              if (uVar4 != 0) {
                pcVar17 = "sutherlands";
                uVar13 = 0xb4e;
                goto LAB_001c88ac;
              }
              if (uVar14 == 0xc) {
                uVar4 = ref_phys_mut_sa(local_160[lVar21 + 5],local_160[lVar21],
                                        local_170 / local_160[lVar21],&local_138);
                if (uVar4 != 0) {
                  pcVar17 = "eddy viscosity";
                  uVar13 = 0xb52;
                  goto LAB_001c88ac;
                }
                local_170 = local_138 + local_170;
              }
              dVar10 = (local_108 +
                       (double)local_b8 +
                       local_148 + local_128 + local_128 + local_130 + local_130 + 0.0) *
                       local_170 * local_f8;
              if (dVar10 < 0.0) {
                pcVar17 = "negative weight u2";
                uVar13 = 0xb56;
                goto LAB_001c84d3;
              }
              uVar11 = (ulong)(uVar19 & 0x7fffffff);
              lVar21 = 0;
              do {
                local_e8[uVar11 * 2 + lVar21] =
                     local_150[uVar11 * 2 + lVar21] * dVar10 + local_e8[uVar11 * 2 + lVar21];
                lVar21 = lVar21 + 1;
              } while (lVar21 != 6);
              uVar4 = ref_matrix_healthy_m(local_e8 + lVar20 * 6);
              if (uVar4 != 0) {
                pcVar17 = "u3";
                uVar13 = 0xb5a;
                goto LAB_001c88ac;
              }
              uVar4 = pRVar2->max;
            }
            lVar20 = lVar20 + 1;
            uVar19 = uVar19 + 3;
          } while (lVar20 < (int)uVar4);
          if (0 < (int)uVar4) {
            pRVar3 = pRVar2->global;
            pdVar7 = local_160 + 4;
            uVar11 = 0;
            do {
              if (-1 < pRVar3[uVar11]) {
                local_158[uVar11] = (*pdVar7 * 1.4) / pdVar7[-4];
              }
              uVar11 = uVar11 + 1;
              pdVar7 = (double *)((long)pdVar7 + local_d8);
            } while (uVar4 != uVar11);
          }
        }
        uVar4 = ref_recon_hessian(local_140,local_158,local_150,local_164);
        if (uVar4 == 0) {
          iVar5 = pRVar2->max;
          if (0 < iVar5) {
            local_168 = local_168 & 0xfffffffe;
            local_110 = (local_110 * 18.0) / local_c8;
            uVar14 = 0;
            lVar20 = 0;
            do {
              if (-1 < pRVar2->global[lVar20]) {
                lVar21 = lVar20 * local_e0;
                uVar4 = viscosity_law((local_160[lVar21 + 4] * 1.4) / local_160[lVar21],local_c0,
                                      &local_170);
                if (uVar4 != 0) {
                  pcVar17 = "sutherlands";
                  uVar13 = 0xb64;
                  goto LAB_001c88ac;
                }
                dVar10 = local_170 / 0.2879999999999999;
                if (local_168 == 0xc) {
                  uVar4 = ref_phys_mut_sa(local_160[lVar21 + 5],local_160[lVar21],
                                          local_170 / local_160[lVar21],&local_138);
                  if (uVar4 != 0) {
                    pcVar17 = "eddy viscosity";
                    uVar13 = 0xb69;
                    goto LAB_001c88ac;
                  }
                  auVar26._8_8_ = local_138;
                  auVar26._0_8_ = local_170;
                  auVar22 = divpd(auVar26,_DAT_0021fce0);
                  dVar10 = auVar22._8_8_ + auVar22._0_8_;
                  local_170 = local_170 + local_138;
                }
                uVar11 = (ulong)(uVar14 & 0x7fffffff);
                dVar23 = local_118[lVar20 * 5 + 4];
                lVar21 = 0;
                do {
                  local_e8[uVar11 * 2 + lVar21] =
                       local_150[uVar11 * 2 + lVar21] * dVar10 * local_110 * dVar23 +
                       local_e8[uVar11 * 2 + lVar21];
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 6);
                iVar5 = pRVar2->max;
              }
              lVar20 = lVar20 + 1;
              uVar14 = uVar14 + 3;
            } while (lVar20 < iVar5);
          }
          free(local_f0);
          free(local_120);
          free(local_150);
          free(local_158);
          free(local_118);
          free(local_a8);
          free(local_d0);
          free(local_a0);
          return 0;
        }
        pcVar17 = "hess_u";
        uVar13 = 0xb61;
      }
      else {
        pcVar17 = "hess_u";
        uVar13 = 0xb41;
      }
    }
    else {
      pcVar17 = "hess_u";
      uVar13 = 0xb1e;
    }
  }
  else {
    pcVar17 = "hess_u";
    uVar13 = 0xafb;
  }
  goto LAB_001c88ac;
}

Assistant:

REF_FCN REF_STATUS ref_metric_belme_gu(
    REF_DBL *metric, REF_GRID ref_grid, REF_INT ldim, REF_DBL *prim_dual,
    REF_DBL mach, REF_DBL re, REF_DBL reference_temp,
    REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, node, i, dir;
  REF_INT nequ;
  REF_DBL *lam, *hess_lam, *grad_lam, *sr_lam, *u, *hess_u, *grad_u;
  REF_DBL *omega;
  REF_DBL u1, u2, u3;
  REF_DBL w1, w2, w3;
  REF_DBL diag_system[12];
  REF_DBL weight;
  REF_DBL gamma = 1.4;
  REF_DBL t, mu;
  REF_DBL pr = 0.72;
  REF_DBL turbulent_pr = 0.90;
  REF_DBL thermal_conductivity;
  REF_DBL rho, turb, mu_t;

  nequ = ldim / 2;

  ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(hess_lam, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grad_lam, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(sr_lam, 5 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(u, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(hess_u, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grad_u, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(omega, 9 * ref_node_max(ref_node), REF_DBL, 0.0);

  for (var = 0; var < 5; var++) {
    each_ref_node_valid_node(ref_node, node) {
      lam[node] = prim_dual[var + 1 * nequ + ldim * node];
    }
    RSS(ref_recon_hessian(ref_grid, lam, hess_lam, reconstruction), "hess_lam");
    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_matrix_diag_m(&(hess_lam[6 * node]), diag_system), "decomp");
      sr_lam[var + 5 * node] = MAX(MAX(ABS(ref_matrix_eig(diag_system, 0)),
                                       ABS(ref_matrix_eig(diag_system, 1))),
                                   ABS(ref_matrix_eig(diag_system, 2)));
    }
  } /* SR MAX (eig, min(1e-30*max(det^-1/3)) for all lambda of var */

  var = 4;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_gradient(ref_grid, lam, grad_lam, reconstruction), "grad_u");

  for (dir = 0; dir < 3; dir++) {
    var = 1 + dir;
    each_ref_node_valid_node(ref_node, node) {
      u[node] = prim_dual[var + 0 * nequ + ldim * node];
    }
    RSS(ref_recon_gradient(ref_grid, u, grad_u, reconstruction), "grad_u");
    each_ref_node_valid_node(ref_node, node) {
      ref_math_cross_product(&(grad_u[3 * node]), &(grad_lam[3 * node]),
                             &(omega[3 * dir + 9 * node]));
    }
  }

  var = 1;
  w1 = 20.0;
  w2 = 2.0;
  w3 = 2.0;
  each_ref_node_valid_node(ref_node, node) {
    u[node] = prim_dual[var + 0 * nequ + ldim * node];
  }
  RSS(ref_recon_hessian(ref_grid, u, hess_u, reconstruction), "hess_u");
  each_ref_node_valid_node(ref_node, node) {
    u1 = ABS(prim_dual[1 + ldim * node]);
    u2 = ABS(prim_dual[2 + ldim * node]);
    u3 = ABS(prim_dual[3 + ldim * node]);
    weight = 0.0;
    weight += w1 * sr_lam[1 + 5 * node];
    weight += w2 * sr_lam[2 + 5 * node];
    weight += w3 * sr_lam[3 + 5 * node];
    weight += (w1 * u1 + w2 * u2 + w3 * u3) * sr_lam[4 + 5 * node];
    weight += (5.0 / 3.0) *
              ABS(omega[1 + 2 * 3 + 9 * node] - omega[2 + 1 * 3 + 9 * node]);
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    if (6 == nequ) {
      rho = prim_dual[0 + ldim * node];
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      mu += mu_t;
    }
    weight *= mach / re * mu;
    RAS(weight >= 0.0, "negative weight u1");
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] += weight * hess_u[i + 6 * node];
    }
    RSS(ref_matrix_healthy_m(&(metric[6 * node])), "u1");
  }

  var = 2;
  w1 = 2.0;
  w2 = 20.0;
  w3 = 2.0;
  each_ref_node_valid_node(ref_node, node) {
    u[node] = prim_dual[var + ldim * node];
  }
  RSS(ref_recon_hessian(ref_grid, u, hess_u, reconstruction), "hess_u");
  each_ref_node_valid_node(ref_node, node) {
    u1 = ABS(prim_dual[1 + ldim * node]);
    u2 = ABS(prim_dual[2 + ldim * node]);
    u3 = ABS(prim_dual[3 + ldim * node]);
    weight = 0.0;
    weight += w1 * sr_lam[1 + 5 * node];
    weight += w2 * sr_lam[2 + 5 * node];
    weight += w3 * sr_lam[3 + 5 * node];
    weight += (w1 * u1 + w2 * u2 + w3 * u3) * sr_lam[4 + 5 * node];
    weight += (5.0 / 3.0) *
              ABS(omega[2 + 0 * 3 + 9 * node] - omega[0 + 2 * 3 + 9 * node]);
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    if (6 == nequ) {
      rho = prim_dual[0 + ldim * node];
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      mu += mu_t;
    }
    weight *= mach / re * mu;
    RAS(weight >= 0.0, "negative weight u2");
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] += weight * hess_u[i + 6 * node];
    }
    RSS(ref_matrix_healthy_m(&(metric[6 * node])), "u2");
  }

  var = 3;
  w1 = 2.0;
  w2 = 2.0;
  w3 = 20.0;
  each_ref_node_valid_node(ref_node, node) {
    u[node] = prim_dual[var + ldim * node];
  }
  RSS(ref_recon_hessian(ref_grid, u, hess_u, reconstruction), "hess_u");
  each_ref_node_valid_node(ref_node, node) {
    u1 = ABS(prim_dual[1 + ldim * node]);
    u2 = ABS(prim_dual[2 + ldim * node]);
    u3 = ABS(prim_dual[3 + ldim * node]);
    weight = 0.0;
    weight += w1 * sr_lam[1 + 5 * node];
    weight += w2 * sr_lam[2 + 5 * node];
    weight += w3 * sr_lam[3 + 5 * node];
    weight += (w1 * u1 + w2 * u2 + w3 * u3) * sr_lam[4 + 5 * node];
    weight += (5.0 / 3.0) *
              ABS(omega[0 + 1 * 3 + 9 * node] - omega[1 + 0 * 3 + 9 * node]);
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    if (6 == nequ) {
      rho = prim_dual[0 + ldim * node];
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      mu += mu_t;
    }
    weight *= mach / re * mu;
    RAS(weight >= 0.0, "negative weight u2");
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] += weight * hess_u[i + 6 * node];
    }
    RSS(ref_matrix_healthy_m(&(metric[6 * node])), "u3");
  }

  each_ref_node_valid_node(ref_node, node) {
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    u[node] = t;
  }
  RSS(ref_recon_hessian(ref_grid, u, hess_u, reconstruction), "hess_u");
  each_ref_node_valid_node(ref_node, node) {
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    thermal_conductivity = mu / (pr * (gamma - 1.0));
    if (6 == nequ) {
      rho = prim_dual[0 + ldim * node];
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      thermal_conductivity =
          (mu / (pr * (gamma - 1.0)) + mu_t / (turbulent_pr * (gamma - 1.0)));
      mu += mu_t;
    }
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] += 18.0 * mach / re * thermal_conductivity *
                              sr_lam[4 + 5 * node] * hess_u[i + 6 * node];
    }
  }

  ref_free(omega);
  ref_free(grad_u);
  ref_free(hess_u);
  ref_free(u);
  ref_free(sr_lam);
  ref_free(grad_lam);
  ref_free(hess_lam);
  ref_free(lam);

  return REF_SUCCESS;
}